

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O3

void __thiscall database::Container::_PrepareContainer(Container *this)

{
  pointer __p;
  size_t sVar1;
  pointer __p_00;
  ulong uVar2;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> s_hash;
  vector<database::ComparableString,_std::allocator<database::ComparableString>_> vector;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_39;
  vector<database::ComparableString,_std::allocator<database::ComparableString>_> local_38;
  
  sVar1 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_39,&this->m_name);
  this->m_id = sVar1;
  __p_00 = (pointer)operator_new(0x18);
  (__p_00->
  super__Vector_base<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->
  super__Vector_base<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->
  super__Vector_base<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  __uniq_ptr_impl<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
           *)&this->m_data,__p_00);
  std::
  unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                 *)&local_38);
  if ((this->m_schema)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    uVar2 = 0;
    do {
      local_38.
      super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.
      super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.
      super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>
      ::
      emplace_back<std::vector<database::ComparableString,std::allocator<database::ComparableString>>&>
                ((vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>
                  *)(this->m_data)._M_t.
                    super___uniq_ptr_impl<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_false>
                    ._M_head_impl,&local_38);
      std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::~vector
                (&local_38);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->m_schema)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void database::Container::_PrepareContainer()
{
  std::hash<std::string> s_hash;
  m_id = s_hash(m_name);
  m_data = std::make_unique<database::impl_storage_type>();
  for(size_t i = 0; i < m_schema.size(); i += 1)
  {
    std::vector<database::ComparableString> vector;
    m_data -> emplace_back(vector);
  }
}